

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorMocUic.cxx
# Opt level: O3

bool __thiscall
cmQtAutoGeneratorMocUic::ParallelJobPushUic(cmQtAutoGeneratorMocUic *this,JobHandleT *jobHandle)

{
  string *text;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  _Elt_pointer puVar3;
  _func_int **pp_Var4;
  JobT *pJVar5;
  JobT *pJVar6;
  int iVar7;
  _Elt_pointer puVar8;
  _Elt_pointer puVar9;
  _Map_pointer ppuVar10;
  pthread_mutex_t *__mutex;
  string error;
  string local_98;
  string local_78;
  pthread_mutex_t *local_58;
  cmQtAutoGeneratorMocUic *local_50;
  JobHandleT *local_48;
  string *local_40;
  JobT *local_38;
  
  __mutex = (pthread_mutex_t *)&this->JobsMutex_;
  iVar7 = pthread_mutex_lock(__mutex);
  if (iVar7 != 0) {
    std::__throw_system_error(iVar7);
  }
  if (this->JobThreadsAbort_ == false) {
    puVar8 = (this->JobQueues_).Uic.
             super__Deque_base<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>,_std::allocator<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    puVar3 = (this->JobQueues_).Uic.
             super__Deque_base<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>,_std::allocator<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    local_58 = __mutex;
    local_50 = this;
    local_48 = jobHandle;
    if (puVar8 != puVar3) {
      local_38 = (jobHandle->_M_t).
                 super___uniq_ptr_impl<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmQtAutoGeneratorMocUic::JobT_*,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>
                 .super__Head_base<0UL,_cmQtAutoGeneratorMocUic::JobT_*,_false>._M_head_impl;
      puVar9 = (this->JobQueues_).Uic.
               super__Deque_base<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>,_std::allocator<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last;
      ppuVar10 = (this->JobQueues_).Uic.
                 super__Deque_base<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>,_std::allocator<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_node;
      local_40 = (string *)(local_38 + 9);
      pp_Var4 = local_38[10]._vptr_JobT;
      do {
        pJVar5 = (puVar8->_M_t).
                 super___uniq_ptr_impl<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmQtAutoGeneratorMocUic::JobT_*,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>
                 .super__Head_base<0UL,_cmQtAutoGeneratorMocUic::JobT_*,_false>._M_head_impl;
        if (pJVar5[10]._vptr_JobT == pp_Var4) {
          if (pp_Var4 != (_func_int **)0x0) {
            iVar7 = bcmp(pJVar5[9]._vptr_JobT,(local_40->_M_dataplus)._M_p,(size_t)pp_Var4);
            if (iVar7 != 0) goto LAB_0019b284;
          }
          pJVar6 = local_38;
          this = local_50;
          __mutex = local_58;
          text = (string *)(local_38 + 1);
          pp_Var4 = pJVar5[2]._vptr_JobT;
          if (pp_Var4 == local_38[2]._vptr_JobT) {
            if (pp_Var4 == (_func_int **)0x0) goto LAB_0019b2be;
            iVar7 = bcmp((((string *)(pJVar5 + 1))->_M_dataplus)._M_p,(text->_M_dataplus)._M_p,
                         (size_t)pp_Var4);
            if (iVar7 == 0) goto LAB_0019b2be;
          }
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,"The two source files\n  ","");
          cmQtAutoGen::Quoted(&local_98,(string *)(pJVar6 + 5));
          std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_98._M_dataplus._M_p);
          paVar1 = &local_98.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != paVar1) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)&local_78);
          cmQtAutoGen::Quoted(&local_98,(string *)(pJVar5 + 5));
          std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_98._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != paVar1) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)&local_78);
          cmQtAutoGen::Quoted(&local_98,local_40);
          std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_98._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != paVar1) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)&local_78);
          cmQtAutoGen::Quoted(&local_98,text);
          std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_98._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != paVar1) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)&local_78);
          cmQtAutoGen::Quoted(&local_98,(string *)(pJVar5 + 1));
          std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_98._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != paVar1) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)&local_78);
          cmQtAutoGenerator::Logger::Error(&(this->super_cmQtAutoGenerator).Logger_,UIC,&local_78);
          RegisterJobError(this);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          goto LAB_0019b2be;
        }
LAB_0019b284:
        puVar8 = puVar8 + 1;
        if (puVar8 == puVar9) {
          puVar8 = ppuVar10[1];
          ppuVar10 = ppuVar10 + 1;
          puVar9 = puVar8 + 0x40;
        }
      } while (puVar8 != puVar3);
    }
    this = local_50;
    __mutex = local_58;
    std::
    deque<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,std::default_delete<cmQtAutoGeneratorMocUic::JobT>>,std::allocator<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,std::default_delete<cmQtAutoGeneratorMocUic::JobT>>>>
    ::
    emplace_back<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,std::default_delete<cmQtAutoGeneratorMocUic::JobT>>>
              ((deque<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,std::default_delete<cmQtAutoGeneratorMocUic::JobT>>,std::allocator<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,std::default_delete<cmQtAutoGeneratorMocUic::JobT>>>>
                *)&(local_50->JobQueues_).Uic,local_48);
  }
LAB_0019b2be:
  bVar2 = this->JobError_;
  pthread_mutex_unlock(__mutex);
  return (bool)(bVar2 ^ 1);
}

Assistant:

bool cmQtAutoGeneratorMocUic::ParallelJobPushUic(JobHandleT& jobHandle)
{
  std::lock_guard<std::mutex> jobsLock(JobsMutex_);
  if (!JobThreadsAbort_) {
    bool pushJobHandle = true;
    // Look for include collisions.
    const JobUicT& uicJob(static_cast<JobUicT&>(*jobHandle));
    for (const JobHandleT& otherHandle : JobQueues_.Uic) {
      const JobUicT& otherJob(static_cast<JobUicT&>(*otherHandle));
      if (otherJob.IncludeString == uicJob.IncludeString) {
        // Check if the same uic file would be generated from different
        // source files which would be an error.
        if (otherJob.SourceFile != uicJob.SourceFile) {
          // Include string collision
          std::string error = "The two source files\n  ";
          error += Quoted(uicJob.IncluderFile);
          error += " and\n  ";
          error += Quoted(otherJob.IncluderFile);
          error += "\ncontain the same uic include string ";
          error += Quoted(uicJob.IncludeString);
          error += "\nbut the uic file would be generated from different "
                   "source files\n  ";
          error += Quoted(uicJob.SourceFile);
          error += " and\n  ";
          error += Quoted(otherJob.SourceFile);
          error +=
            ".\nConsider to\n"
            "- add a directory prefix to a \"ui_<NAME>.h\" include "
            "(e.g \"sub/ui_<NAME>.h\")\n"
            "- rename the <NAME>.ui file(s) and adjust the \"ui_<NAME>.h\" "
            "include(s)\n";
          Log().Error(GenT::UIC, error);
          RegisterJobError();
        }
        // Do not push this job in since the uic file already
        // gets generated by an other job.
        pushJobHandle = false;
        break;
      }
    }
    if (pushJobHandle) {
      JobQueues_.Uic.emplace_back(std::move(jobHandle));
    }
  }
  return !JobError_;
}